

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<std::array<float,_3UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::array<float,3ul>>
          (optional<std::array<float,_3UL>_> *__return_storage_ptr__,PrimVar *this)

{
  optional<std::array<float,_3UL>_> local_20;
  
  get_value<std::array<float,3ul>>(&local_20,this);
  __return_storage_ptr__->has_value_ = local_20.has_value_;
  if (local_20.has_value_ == true) {
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_20.contained._8_4_;
    *(undefined8 *)&__return_storage_ptr__->contained = local_20.contained._0_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }